

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O2

bool __thiscall HighFreqDataType::operator==(HighFreqDataType *this,HighFreqDataType *obj)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  
  bVar1 = std::operator!=(&this->name,&obj->name);
  bVar2 = std::operator!=(&this->origin,&obj->origin);
  bVar3 = std::operator!=(&this->sockAddr,&obj->sockAddr);
  return (!bVar3 && (!bVar2 && !bVar1)) && this->byteSize == obj->byteSize;
}

Assistant:

bool HighFreqDataType::operator ==(const HighFreqDataType &obj) {
    bool retval = true;
    if (name != obj.name)
        retval = false;
    if (origin != obj.origin)
        retval = false;
    if (sockAddr != obj.sockAddr)
        retval = false;
    if (byteSize != obj.byteSize)
        retval = false;

    return(retval);
}